

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::Vector::Decode(Vector *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar1) {
    KDataStream::Read<float>(stream,(float *)&this->m_f32X);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Y);
    KDataStream::Read<float>(stream,(float *)&this->m_f32Z);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Vector::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < VECTOR_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f32X
           >> m_f32Y
           >> m_f32Z;
}